

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void traverseclosure(global_State *g,Closure *cl)

{
  long in_RSI;
  GCObject *in_RDI;
  int i_1;
  int i;
  int local_18;
  int local_14;
  
  if ((*(byte *)(*(long *)(in_RSI + 0x18) + 9) & 3) != 0) {
    reallymarkobject(_i_1,in_RDI);
  }
  if (*(char *)(in_RSI + 10) == '\0') {
    if ((*(byte *)(*(long *)(in_RSI + 0x20) + 9) & 3) != 0) {
      reallymarkobject(_i_1,in_RDI);
    }
    for (local_18 = 0; local_18 < (int)(uint)*(byte *)(in_RSI + 0xb); local_18 = local_18 + 1) {
      if ((*(byte *)(*(long *)(in_RSI + 0x28 + (long)local_18 * 8) + 9) & 3) != 0) {
        reallymarkobject(_i_1,in_RDI);
      }
    }
  }
  else {
    for (local_14 = 0; local_14 < (int)(uint)*(byte *)(in_RSI + 0xb); local_14 = local_14 + 1) {
      if ((3 < *(int *)(in_RSI + (long)local_14 * 0x10 + 0x30)) &&
         ((*(byte *)(*(long *)(in_RSI + 0x28 + (long)local_14 * 0x10) + 9) & 3) != 0)) {
        reallymarkobject(_i_1,in_RDI);
      }
    }
  }
  return;
}

Assistant:

static void traverseclosure(global_State*g,Closure*cl){
markobject(g,cl->c.env);
if(cl->c.isC){
int i;
for(i=0;i<cl->c.nupvalues;i++)
markvalue(g,&cl->c.upvalue[i]);
}
else{
int i;
markobject(g,cl->l.p);
for(i=0;i<cl->l.nupvalues;i++)
markobject(g,cl->l.upvals[i]);
}
}